

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_non_uniform.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateGroupNonUniformAllEqual
          (ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint32_t id;
  DiagnosticStream *pDVar2;
  DiagnosticStream local_3d8;
  uint32_t local_1fc;
  undefined1 local_1f8 [4];
  uint32_t value_type;
  Instruction *local_20;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  local_20 = inst;
  inst_local = (Instruction *)_;
  id = val::Instruction::type_id(inst);
  bVar1 = ValidationState_t::IsBoolScalarType(_,id);
  if (bVar1) {
    local_1fc = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,local_20,3);
    bVar1 = ValidationState_t::IsFloatScalarOrVectorType((ValidationState_t *)inst_local,local_1fc);
    if (((!bVar1) &&
        (bVar1 = ValidationState_t::IsIntScalarOrVectorType
                           ((ValidationState_t *)inst_local,local_1fc), !bVar1)) &&
       (bVar1 = ValidationState_t::IsBoolScalarOrVectorType
                          ((ValidationState_t *)inst_local,local_1fc), !bVar1)) {
      ValidationState_t::diag
                (&local_3d8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,local_20);
      pDVar2 = DiagnosticStream::operator<<
                         (&local_3d8,
                          (char (*) [77])
                          "Value must be a scalar or vector of integer, floating-point, or boolean type"
                         );
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
      DiagnosticStream::~DiagnosticStream(&local_3d8);
      return __local._4_4_;
    }
    __local._4_4_ = SPV_SUCCESS;
  }
  else {
    ValidationState_t::diag
              ((DiagnosticStream *)local_1f8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
               local_20);
    pDVar2 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)local_1f8,
                        (char (*) [37])"Result must be a boolean scalar type");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_1f8);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateGroupNonUniformAllEqual(ValidationState_t& _,
                                             const Instruction* inst) {
  if (!_.IsBoolScalarType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Result must be a boolean scalar type";
  }

  const auto value_type = _.GetOperandTypeId(inst, 3);
  if (!_.IsFloatScalarOrVectorType(value_type) &&
      !_.IsIntScalarOrVectorType(value_type) &&
      !_.IsBoolScalarOrVectorType(value_type)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Value must be a scalar or vector of integer, floating-point, or "
              "boolean type";
  }

  return SPV_SUCCESS;
}